

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

bool __thiscall wabt::anon_unknown_24::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  undefined1 uVar1;
  
  uVar1 = 1;
  if (3 < (uint)(type.enum_ + I8U)) {
    if (2 < (uint)(type.enum_ + 0x12)) {
      if (type.enum_ == Exnref) {
        if ((this->options_->features).reference_types_enabled_ == true) {
          return (this->options_->features).exceptions_enabled_;
        }
      }
      else if (type.enum_ == V128) {
        return (this->options_->features).simd_enabled_;
      }
      return false;
    }
    uVar1 = (this->options_->features).reference_types_enabled_;
  }
  return (bool)uVar1;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::Funcref:
    case Type::Anyref:
    case Type::Nullref:
      return options_.features.reference_types_enabled();

    case Type::Exnref:
      return options_.features.reference_types_enabled() &&
             options_.features.exceptions_enabled();

    default:
      return false;
  }
}